

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O0

void __thiscall wasm::ReferenceFinder::noteRefFunc(ReferenceFinder *this,Name refFunc)

{
  ReferenceFinder *this_local;
  Name refFunc_local;
  
  refFunc_local.super_IString.str._M_len = refFunc.super_IString.str._M_str;
  this_local = refFunc.super_IString.str._M_len;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
            (&this->refFuncs,(value_type *)&this_local);
  return;
}

Assistant:

void noteRefFunc(Name refFunc) { refFuncs.push_back(refFunc); }